

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotMap.c
# Opt level: O0

void destroyPath(Path *path)

{
  uint local_1c;
  TileNode *pTStack_18;
  int i;
  TileNode *nextNode;
  Path *path_local;
  
  pTStack_18 = (TileNode *)0x0;
  if (path->count != 0) {
    pTStack_18 = path->first;
  }
  for (local_1c = 0; local_1c < path->count; local_1c = local_1c + 1) {
    while (pTStack_18->next != (TileNode *)0x0) {
      pTStack_18 = pTStack_18->next;
      free(pTStack_18);
      path->count = path->count - 1;
    }
  }
  free(path);
  return;
}

Assistant:

void destroyPath(struct Path *path) {
    struct TileNode *nextNode = NULL;

    if (path->count > 0)
        nextNode = path->first;

    for (int i = 0; i < path->count; i++) {
        while (nextNode->next != NULL) {
            nextNode = nextNode->next;
            free(nextNode);
            path->count--;
        }
    }
    free(path);
}